

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O2

iterator * __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::first
          (iterator *this)

{
  node_ptr node;
  iterator *piVar1;
  
  invalidate(this);
  node.tagged_ptr = (this->db_->root).tagged_ptr;
  if (node.tagged_ptr != 0) {
    piVar1 = left_most_traversal(this,node);
    return piVar1;
  }
  return this;
}

Assistant:

typename db<Key, Value>::iterator& db<Key, Value>::iterator::first() {
  invalidate();  // clear the stack
  if (UNODB_DETAIL_UNLIKELY(db_.root == nullptr)) return *this;  // empty tree.
  const auto node{db_.root};
  return left_most_traversal(node);
}